

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::advance_setup
          (NavierStokesBase *this,Real param_2,Real dt,int iteration,int ncycle)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  BoxArray *pBVar8;
  NavierStokesBase *pNVar9;
  MFInfo *info;
  FabFactory<amrex::FArrayBox> *val;
  int in_ESI;
  long in_RDI;
  bool has_old_data;
  int k;
  BoxArray *edgeba;
  int dir;
  int ng_sync;
  int finest_level;
  NavierStokesBase *in_stack_fffffffffffffdc8;
  NavierStokesBase *in_stack_fffffffffffffdd0;
  Real in_stack_fffffffffffffdd8;
  BndryRegister *in_stack_fffffffffffffde0;
  NavierStokesBase *this_00;
  int in_stack_fffffffffffffdf8;
  MFInfo *in_stack_fffffffffffffe00;
  DistributionMapping *dm;
  BoxArray *in_stack_fffffffffffffe08;
  MultiFab *in_stack_fffffffffffffe10;
  BoxArray *in_stack_fffffffffffffe18;
  MultiFab *in_stack_fffffffffffffe20;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffe30;
  undefined8 *puVar10;
  StateData *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  int level;
  MacProj *in_stack_fffffffffffffe60;
  int local_110;
  DistributionMapping local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  BoxArray *local_a8;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Real in_stack_ffffffffffffff88;
  NavierStokesBase *in_stack_ffffffffffffff90;
  
  level = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  iVar5 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  *(uint *)(in_RDI + 0xb88) = (uint)!bVar4;
  MacProj::setup(in_stack_fffffffffffffe60,level);
  if (*(int *)(in_RDI + 8) < iVar5) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    if (bVar4) {
      nghost_state(in_stack_fffffffffffffdc8);
    }
    bVar4 = amrex::FabArrayBase::empty((FabArrayBase *)0x7b4bca);
    if (bVar4) {
      amrex::MFInfo::MFInfo((MFInfo *)0x7b4c4f);
      in_stack_fffffffffffffdc8 =
           (NavierStokesBase *)amrex::AmrLevel::Factory(&in_stack_fffffffffffffdd0->super_AmrLevel);
      amrex::MultiFab::define
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (DistributionMapping *)in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffe30);
      amrex::MFInfo::~MFInfo((MFInfo *)0x7b4ca6);
    }
    bVar4 = amrex::FabArrayBase::empty((FabArrayBase *)0x7b4ce2);
    if (bVar4) {
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      in_stack_ffffffffffffff88 = 0.0;
      amrex::MFInfo::MFInfo((MFInfo *)0x7b4d77);
      in_stack_fffffffffffffdc8 =
           (NavierStokesBase *)amrex::AmrLevel::Factory(&in_stack_fffffffffffffdd0->super_AmrLevel);
      amrex::MultiFab::define
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (DistributionMapping *)in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffe30);
      amrex::MFInfo::~MFInfo((MFInfo *)0x7b4dd0);
    }
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffdd0,
               (value_type)in_stack_fffffffffffffdc8);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffdd0,
               (value_type)in_stack_fffffffffffffdc8);
  }
  if ((do_reflux != 0) && (*(int *)(in_RDI + 8) < iVar5)) {
    getAdvFluxReg(in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    amrex::BndryRegister::setVal(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    getViscFluxReg(in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    amrex::BndryRegister::setVal(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  if ((*(long *)(in_RDI + 0xb80) == 0) ||
     (iVar5 = amrex::FabArrayBase::nGrow(*(FabArrayBase **)(in_RDI + 0xb80),0),
     iVar5 < *(int *)(in_RDI + 0xb88))) {
    if ((*(long *)(in_RDI + 0xb80) != 0) && (lVar2 = *(long *)(in_RDI + 0xb80), lVar2 != 0)) {
      lVar3 = *(long *)(lVar2 + -8);
      lVar6 = lVar2 + lVar3 * 0x180;
      while (lVar2 != lVar6) {
        lVar6 = lVar6 + -0x180;
        amrex::MultiFab::~MultiFab((MultiFab *)0x7b4f4b);
      }
      operator_delete__((void *)(lVar2 + -8),lVar3 * 0x180 + 8);
    }
    puVar7 = (undefined8 *)operator_new__(0x488);
    *puVar7 = 3;
    in_stack_fffffffffffffe50 = (StateData *)(puVar7 + 0x91);
    puVar10 = puVar7 + 1;
    do {
      amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffdd0);
      puVar10 = puVar10 + 0x30;
    } while ((StateData *)puVar10 != in_stack_fffffffffffffe50);
    *(undefined8 **)(in_RDI + 0xb80) = puVar7 + 1;
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      pBVar8 = amrex::AmrLevel::getEdgeBoxArray
                         (&in_stack_fffffffffffffdd0->super_AmrLevel,
                          (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
      lVar2 = *(long *)(in_RDI + 0xb80);
      in_stack_fffffffffffffe08 = (BoxArray *)((long)local_9c * 0x180);
      in_stack_fffffffffffffe10 =
           (MultiFab *)((long)&(in_stack_fffffffffffffe08->m_bat).m_bat_type + lVar2);
      in_stack_fffffffffffffe20 = (MultiFab *)(in_RDI + 0x140);
      uVar1 = *(undefined4 *)(in_RDI + 0xb88);
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_b8 = 0;
      puVar10 = &local_d8;
      local_a8 = pBVar8;
      amrex::MFInfo::MFInfo((MFInfo *)0x7b50ca);
      in_stack_fffffffffffffdc8 =
           (NavierStokesBase *)amrex::AmrLevel::Factory(&in_stack_fffffffffffffdd0->super_AmrLevel);
      (**(code **)(*(long *)((long)&(in_stack_fffffffffffffe08->m_bat).m_bat_type + lVar2) + 0x10))
                (in_stack_fffffffffffffe10,pBVar8,in_stack_fffffffffffffe20,1,uVar1,puVar10);
      amrex::MFInfo::~MFInfo((MFInfo *)0x7b5121);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffdd0,
                 (value_type)in_stack_fffffffffffffdc8);
    }
  }
  pNVar9 = (NavierStokesBase *)operator_new(0x180);
  info = (MFInfo *)(in_RDI + 0x140);
  local_f8 = 0;
  uStack_f0 = 0;
  local_108.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_108.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8 = 0;
  dm = &local_108;
  this_00 = pNVar9;
  iVar5 = NUM_STATE;
  amrex::MFInfo::MFInfo((MFInfo *)0x7b5209);
  val = amrex::AmrLevel::Factory(&in_stack_fffffffffffffdd0->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,dm,iVar5,in_stack_fffffffffffffdf8,
             info,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffe20);
  *(NavierStokesBase **)(in_RDI + 0xb90) = pNVar9;
  amrex::MFInfo::~MFInfo((MFInfo *)0x7b526a);
  if (((initial_step == 0) && (0 < *(int *)(in_RDI + 8))) && (in_ESI == 1)) {
    initRhoAvg(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  for (local_110 = 0; local_110 < num_state_type; local_110 = local_110 + 1) {
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffffdd0,(size_type)val);
    bVar4 = amrex::StateData::hasOldData((StateData *)0x7b5332);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffffdd0,(size_type)val);
    amrex::StateData::allocOldData(in_stack_fffffffffffffe50);
    if (!bVar4) {
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffdd0,(size_type)val);
      amrex::StateData::oldData((StateData *)in_stack_fffffffffffffdd0);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffdd0,(value_type)val);
    }
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffffdd0,(size_type)val);
    amrex::StateData::swapTimeLevels((StateData *)in_stack_fffffffffffffdd0,(Real)val);
  }
  make_rho_prev_time(this_00);
  return;
}

Assistant:

void
NavierStokesBase::advance_setup (Real /*time*/,
                                 Real dt,
                                 int  iteration,
                                 int  ncycle)
{
    BL_PROFILE("NavierStokesBase::advance_setup()");

    const int finest_level = parent->finestLevel();

    // Same for EB vs not.
    umac_n_grow = (advection_scheme == "MOL") ? 0 : 1;

#ifdef AMREX_PARTICLES
    if (ncycle > umac_n_grow) {
        umac_n_grow = ncycle;
    }
#endif

    mac_projector->setup(level);
    //
    // Why are they defined here versus the constructor?
    //
    if (level < finest_level)
    {
#ifdef AMREX_USE_EB
        int ng_sync = (redistribution_type == "StateRedist") ? nghost_state() : 1;
#else
        int ng_sync = 1;
#endif

        if (Vsync.empty()) {
            Vsync.define(grids,dmap,AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        }
        if (Ssync.empty()) {
            Ssync.define(grids,dmap,NUM_STATE-AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        }
        Vsync.setVal(0);
        Ssync.setVal(0);
    }
    //
    // Set reflux registers to zero.
    //
    if (do_reflux && level < finest_level)
    {
        getAdvFluxReg(level+1).setVal(0);
        getViscFluxReg(level+1).setVal(0);
    }
    //
    // Alloc space for edge velocities (normal comp only).
    //
    if (u_mac == 0 || u_mac[0].nGrow() < umac_n_grow)
    {
        if (u_mac != 0) {
            delete [] u_mac;
        }

        u_mac = new MultiFab[AMREX_SPACEDIM];

        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            const BoxArray& edgeba = getEdgeBoxArray(dir);
            u_mac[dir].define(edgeba,dmap,1,umac_n_grow,MFInfo(),Factory());
            u_mac[dir].setVal(1.e40);
        }
    }
    //
    // Alloc MultiFab to hold advective update terms.
    //
    AMREX_ASSERT(aofs == 0);
    aofs = new MultiFab(grids,dmap,NUM_STATE,0,MFInfo(),Factory());

    //
    // Set rho_avg.
    //
    if (!initial_step && level > 0 && iteration == 1) {
        initRhoAvg(0.5/Real(ncycle));
    }
    //
    // Set up state multifabs for the advance.
    //
    for (int k = 0; k < num_state_type; k++)
    {
        bool has_old_data = state[k].hasOldData();
        // does nothing if old_data!=null
        state[k].allocOldData();
        if (! has_old_data) {
            state[k].oldData().setVal(0.0);
        }
        // swaps pointers-- reuses space, but doesn't leave new with good data.
        state[k].swapTimeLevels(dt);
    }

    make_rho_prev_time();

    // refRatio==4 is not currently supported
    //
    // If refRatio==4 to the next level coarser, and we're going to diffuse
    // scalars as SoverRho, we're going to need rho at 1/4 and 3/4 time there.
    // Make these things if need be.
    //
    // if (level > 0)
    // {
    //     bool needs_rho4 = false;

    //     if (parent->nCycle(level) == 4)
    //         for (int i = 0; i < NUM_STATE && !needs_rho4; ++i)
    //             needs_rho4 = (diffusionType[i] == Laplacian_SoverRho);

    //     if (needs_rho4)
    //     {
    //         NavierStokesBase& clevel = getLevel(level-1);
    //         const BoxArray& cgrids = clevel.boxArray();
    //         const DistributionMapping& cdmap = clevel.DistributionMap();
    //         const Real      ptime  = clevel.state[State_Type].prevTime();
    //         const Real      ctime  = clevel.state[State_Type].curTime();

    //         if (clevel.rho_qtime == 0)
    //         {
    //             const Real qtime = ptime + 0.25*(ctime-ptime);
    //             clevel.rho_qtime = new MultiFab(cgrids,cdmap,1,1);
    //             FillPatch(clevel,*(clevel.rho_qtime),1,qtime,State_Type,Density,1,0);
    //         }
    //         if (clevel.rho_tqtime == 0)
    //         {
    //             const Real tqtime = ptime + 0.75*(ctime-ptime);
    //             clevel.rho_tqtime = new MultiFab(cgrids,cdmap,1,1);
    // 		FillPatch(clevel, *(clevel.rho_tqtime), 1, tqtime, State_Type, Density, 1, 0);
    //         }
    //    }
    // }
}